

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

ZSTD_CCtx_params * duckdb_zstd::ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_paramSwitch_e ZVar1;
  size_t sVar2;
  ZSTD_CCtx_params *in_RDI;
  
  if (in_RDI == (ZSTD_CCtx_params *)0x0) {
    uRam0000000000000004 = cParams._0_8_;
    uRam0000000000000018 = cParams._20_8_;
    uRam000000000000000c = cParams.hashLog;
    uRam0000000000000010 = cParams.searchLog;
    uRam0000000000000014 = cParams.minMatch;
    if (_DAT_00000060 == 0) goto LAB_003887b0;
    if (_DAT_00000060 != 1) goto LAB_003887fc;
  }
  else {
    memset(in_RDI,0,0xd8);
    in_RDI->compressionLevel = 3;
    (in_RDI->fParams).contentSizeFlag = 1;
    (in_RDI->cParams).windowLog = cParams.windowLog;
    (in_RDI->cParams).chainLog = cParams.chainLog;
    (in_RDI->cParams).hashLog = cParams.hashLog;
    (in_RDI->cParams).searchLog = cParams.searchLog;
    (in_RDI->cParams).searchLog = cParams.searchLog;
    (in_RDI->cParams).minMatch = cParams.minMatch;
    (in_RDI->cParams).targetLength = cParams.targetLength;
    (in_RDI->cParams).strategy = cParams.strategy;
LAB_003887b0:
    if (((int)cParams.strategy < 7) || (cParams.windowLog < 0x1b)) {
      (in_RDI->ldmParams).enableLdm = ZSTD_ps_disable;
      goto LAB_003887fc;
    }
    (in_RDI->ldmParams).enableLdm = ZSTD_ps_enable;
  }
  ZSTD_ldm_adjustParameters(&in_RDI->ldmParams,&cParams);
LAB_003887fc:
  ZVar1 = in_RDI->useBlockSplitter;
  if (ZVar1 == ZSTD_ps_auto) {
    if ((int)cParams.strategy < 7) {
      ZVar1 = ZSTD_ps_disable;
    }
    else {
      ZVar1 = (cParams.windowLog < 0x11) + ZSTD_ps_enable;
    }
  }
  in_RDI->useBlockSplitter = ZVar1;
  ZVar1 = ZSTD_resolveRowMatchFinderMode(in_RDI->useRowMatchFinder,&cParams);
  in_RDI->useRowMatchFinder = ZVar1;
  sVar2 = 0x20000;
  if (in_RDI->maxBlockSize != 0) {
    sVar2 = in_RDI->maxBlockSize;
  }
  in_RDI->maxBlockSize = sVar2;
  ZVar1 = (in_RDI->compressionLevel < 10) + ZSTD_ps_enable;
  if (in_RDI->searchForExternalRepcodes != ZSTD_ps_auto) {
    ZVar1 = in_RDI->searchForExternalRepcodes;
  }
  in_RDI->searchForExternalRepcodes = ZVar1;
  return in_RDI;
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    /* should not matter, as all cParams are presumed properly defined */
    ZSTD_CCtxParams_init(&cctxParams, ZSTD_CLEVEL_DEFAULT);
    cctxParams.cParams = cParams;

    /* Adjust advanced params according to cParams */
    cctxParams.ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams.ldmParams.enableLdm, &cParams);
    if (cctxParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_ldm_adjustParameters(&cctxParams.ldmParams, &cParams);
        assert(cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog);
        assert(cctxParams.ldmParams.hashRateLog < 32);
    }
    cctxParams.useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams.useBlockSplitter, &cParams);
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);
    cctxParams.validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams.validateSequences);
    cctxParams.maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams.maxBlockSize);
    cctxParams.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams.searchForExternalRepcodes,
                                                                             cctxParams.compressionLevel);
    assert(!ZSTD_checkCParams(cParams));
    return cctxParams;
}